

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XIncludeUtils::isInCurrentInclusionHistoryStack(XIncludeUtils *this,XMLCh *toFind)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XIncludeHistoryNode *pXVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  
  pXVar3 = this->fIncludeHistoryHead;
  do {
    if (pXVar3 == (XIncludeHistoryNode *)0x0) {
      return false;
    }
    pXVar4 = pXVar3->URI;
    if (pXVar4 == toFind) {
      return true;
    }
    pXVar5 = toFind;
    if (pXVar4 == (XMLCh *)0x0 || toFind == (XMLCh *)0x0) {
      if (toFind == (XMLCh *)0x0) {
        if (pXVar4 == (XMLCh *)0x0) {
          return true;
        }
      }
      else if (*toFind != L'\0' || pXVar4 == (XMLCh *)0x0) {
        if (*toFind == L'\0') {
          return true;
        }
        goto LAB_0033d228;
      }
LAB_0033d222:
      if (*pXVar4 == L'\0') {
        return true;
      }
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_0033d222;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
    }
LAB_0033d228:
    pXVar3 = pXVar3->next;
  } while( true );
}

Assistant:

bool
XIncludeUtils::isInCurrentInclusionHistoryStack(const XMLCh *toFind){
    XIncludeHistoryNode *historyCursor = fIncludeHistoryHead;
    /* walk the list */
    while (historyCursor != NULL){
        if (XMLString::equals(toFind, historyCursor->URI)){
            return true;
        }
        historyCursor = historyCursor->next;
    }
    return false;
}